

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  uint uVar1;
  long lVar2;
  type_conflict5 tVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  uint local_2f4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  
  bVar19 = 0;
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar4) + 0xfe8) + 0x98));
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar10 = **(long **)(CONCAT44(extraout_var_00,iVar4) + 0xfe8);
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar9 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar4) + 0xfe8) + 0xb8);
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar8 = *(long *)(CONCAT44(extraout_var_02,iVar4) + 0xfe8);
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar2 = *(long *)(CONCAT44(extraout_var_03,iVar4) + 0xfb0);
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar16 = *(long *)(CONCAT44(extraout_var_04,iVar4) + 0xfc8);
  iVar4 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var_05,iVar4));
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  local_138.prec_elem = 0x1c;
  y.m_backend.data._M_elems._0_8_ = (ulong)y.m_backend.data._M_elems[1] << 0x20;
  tVar3 = boost::multiprecision::operator>(val,(int *)&y);
  pnVar12 = &(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).delta;
  if (tVar3) {
    local_2f4 = 0xffffffff;
    lVar18 = 0;
    while( true ) {
      lVar7 = 0x1c;
      if (*(int *)(lVar8 + 0xa0) <= lVar18) break;
      uVar1 = *(uint *)(*(long *)(lVar8 + 0xa8) + lVar18 * 4);
      lVar17 = (long)(int)uVar1 * 0x80;
      puVar14 = (uint *)(lVar9 + lVar17);
      pcVar13 = &local_138;
      for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_138.exp = *(int *)(lVar9 + 0x70 + lVar17);
      local_138.neg = *(bool *)(lVar9 + 0x74 + lVar17);
      local_138._120_8_ = *(undefined8 *)(lVar9 + 0x78 + lVar17);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_138,&epsilon);
      if (tVar3) {
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar5,(type *)0x0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar2 + lVar17),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar3) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar2 + lVar17),
                     (cpp_dec_float<200U,_int,_void> *)(lVar17 + lVar10));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&pnVar12->m_backend);
LAB_00445733:
          pcVar13 = &y.m_backend;
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x1c;
          lVar7 = 0x1c;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems[0xe] = 0;
          y.m_backend.data._M_elems[0xf] = 0;
          y.m_backend.data._M_elems[0x10] = 0;
          y.m_backend.data._M_elems[0x11] = 0;
          y.m_backend.data._M_elems[0x12] = 0;
          y.m_backend.data._M_elems[0x13] = 0;
          y.m_backend.data._M_elems[0x14] = 0;
          y.m_backend.data._M_elems[0x15] = 0;
          y.m_backend.data._M_elems[0x16] = 0;
          y.m_backend.data._M_elems[0x17] = 0;
          y.m_backend.data._M_elems[0x18] = 0;
          y.m_backend.data._M_elems[0x19] = 0;
          y.m_backend.data._M_elems._104_5_ = 0;
          y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (pcVar13,&result_1.m_backend,&local_138);
          tVar3 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar13,val);
          pnVar11 = val;
          if (tVar3) {
            for (; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar11->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
            }
            (val->m_backend).exp = y.m_backend.exp;
            (val->m_backend).neg = y.m_backend.neg;
            (val->m_backend).fpclass = y.m_backend.fpclass;
            (val->m_backend).prec_elem = y.m_backend.prec_elem;
            local_2f4 = uVar1;
          }
        }
      }
      else {
        pnVar11 = &epsilon;
        pnVar15 = &y;
        for (; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_138,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar3) {
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar5,(type *)0x0);
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar16 + lVar17),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar3) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar16 + lVar17),
                       (cpp_dec_float<200U,_int,_void> *)(lVar17 + lVar10));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&pnVar12->m_backend);
            goto LAB_00445733;
          }
        }
      }
      lVar18 = lVar18 + 1;
    }
    if ((int)local_2f4 < 0) {
      return local_2f4;
    }
    lVar7 = (ulong)local_2f4 * 0x80;
    puVar14 = (uint *)(lVar9 + lVar7);
    pcVar13 = &local_138;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] = *puVar14;
      puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_138.exp = *(int *)(lVar9 + 0x70 + lVar7);
    local_138.neg = *(bool *)(lVar9 + 0x74 + lVar7);
    local_138._120_8_ = *(undefined8 *)(lVar9 + 0x78 + lVar7);
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_138,&epsilon);
    if ((!tVar3) ||
       (tVar3 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar10 + lVar7),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar2 + lVar7)), !tVar3)) {
      pnVar12 = &epsilon;
      pnVar11 = &y;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      y.m_backend.exp = epsilon.m_backend.exp;
      y.m_backend.neg = epsilon.m_backend.neg;
      y.m_backend.fpclass = epsilon.m_backend.fpclass;
      y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
      if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0) {
        y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
      }
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_138,&y);
      if ((!tVar3) ||
         (tVar3 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar10 + lVar7),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar16 + lVar7)), !tVar3)) {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_138,&epsilon);
        goto LAB_00445daf;
      }
    }
  }
  else {
    local_2f4 = 0xffffffff;
    for (lVar18 = 0; lVar18 < *(int *)(lVar8 + 0xa0); lVar18 = lVar18 + 1) {
      uVar1 = *(uint *)(*(long *)(lVar8 + 0xa8) + lVar18 * 4);
      lVar17 = (long)(int)uVar1 * 0x80;
      lVar7 = 0x1c;
      puVar14 = (uint *)(lVar9 + lVar17);
      pcVar13 = &local_138;
      for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_138.exp = *(int *)(lVar9 + 0x70 + lVar17);
      local_138.neg = (bool)*(undefined1 *)(lVar9 + 0x74 + lVar17);
      local_138._120_8_ = *(undefined8 *)(lVar9 + 0x78 + lVar17);
      pnVar11 = &epsilon;
      pcVar13 = &y.m_backend;
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
      }
      y.m_backend.exp = epsilon.m_backend.exp;
      y.m_backend.neg = epsilon.m_backend.neg;
      y.m_backend.fpclass = epsilon.m_backend.fpclass;
      y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
      if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0) {
        y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
      }
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_138,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&y.m_backend);
      if (tVar3) {
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar5,(type *)0x0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar2 + lVar17),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar3) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar2 + lVar17),
                     (cpp_dec_float<200U,_int,_void> *)(lVar17 + lVar10));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&pnVar12->m_backend);
LAB_00445bf7:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x1c;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems[0xe] = 0;
          y.m_backend.data._M_elems[0xf] = 0;
          y.m_backend.data._M_elems[0x10] = 0;
          y.m_backend.data._M_elems[0x11] = 0;
          y.m_backend.data._M_elems[0x12] = 0;
          y.m_backend.data._M_elems[0x13] = 0;
          y.m_backend.data._M_elems[0x14] = 0;
          y.m_backend.data._M_elems[0x15] = 0;
          y.m_backend.data._M_elems[0x16] = 0;
          y.m_backend.data._M_elems[0x17] = 0;
          y.m_backend.data._M_elems[0x18] = 0;
          y.m_backend.data._M_elems[0x19] = 0;
          y.m_backend.data._M_elems._104_5_ = 0;
          y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_138);
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,val);
          if (tVar3) {
            pcVar13 = &y.m_backend;
            pnVar11 = val;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar11->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
            }
            (val->m_backend).exp = y.m_backend.exp;
            (val->m_backend).neg = y.m_backend.neg;
            (val->m_backend).fpclass = y.m_backend.fpclass;
            (val->m_backend).prec_elem = y.m_backend.prec_elem;
            local_2f4 = uVar1;
          }
        }
      }
      else {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_138,&epsilon);
        if (tVar3) {
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar5,(type *)0x0);
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar16 + lVar17),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar3) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar16 + lVar17),
                       (cpp_dec_float<200U,_int,_void> *)(lVar17 + lVar10));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&pnVar12->m_backend);
            goto LAB_00445bf7;
          }
        }
      }
    }
    if ((int)local_2f4 < 0) {
      return local_2f4;
    }
    lVar7 = (ulong)local_2f4 * 0x80;
    lVar8 = 0x1c;
    puVar14 = (uint *)(lVar9 + lVar7);
    pcVar13 = &local_138;
    for (lVar18 = lVar8; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pcVar13->data)._M_elems[0] = *puVar14;
      puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
    }
    local_138.exp = *(int *)(lVar9 + 0x70 + lVar7);
    local_138.neg = (bool)*(undefined1 *)(lVar9 + 0x74 + lVar7);
    local_138._120_8_ = *(undefined8 *)(lVar9 + 0x78 + lVar7);
    pnVar12 = &epsilon;
    pnVar11 = &y;
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    y.m_backend.exp = epsilon.m_backend.exp;
    y.m_backend.neg = epsilon.m_backend.neg;
    y.m_backend.fpclass = epsilon.m_backend.fpclass;
    y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0) {
      y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
    }
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_138,&y);
    if (((!tVar3) ||
        (tVar3 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar10 + lVar7),
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar2 + lVar7)), !tVar3)) &&
       ((tVar3 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,&epsilon), !tVar3 ||
        (tVar3 = boost::multiprecision::operator<=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar10 + lVar7),
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar16 + lVar7)), !tVar3)))) {
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_138,&epsilon);
LAB_00445daf:
      if (tVar3 != false) {
        lVar16 = lVar2;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&val->m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar16 + lVar7));
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&val->m_backend,
                 (cpp_dec_float<200U,_int,_void> *)(lVar10 + lVar7));
      y.m_backend.fpclass = cpp_dec_float_finite;
      y.m_backend.prec_elem = 0x1c;
      y.m_backend.data._M_elems[0] = 0;
      y.m_backend.data._M_elems[1] = 0;
      y.m_backend.data._M_elems[2] = 0;
      y.m_backend.data._M_elems[3] = 0;
      y.m_backend.data._M_elems[4] = 0;
      y.m_backend.data._M_elems[5] = 0;
      y.m_backend.data._M_elems[6] = 0;
      y.m_backend.data._M_elems[7] = 0;
      y.m_backend.data._M_elems[8] = 0;
      y.m_backend.data._M_elems[9] = 0;
      y.m_backend.data._M_elems[10] = 0;
      y.m_backend.data._M_elems[0xb] = 0;
      y.m_backend.data._M_elems[0xc] = 0;
      y.m_backend.data._M_elems[0xd] = 0;
      y.m_backend.data._M_elems[0xe] = 0;
      y.m_backend.data._M_elems[0xf] = 0;
      y.m_backend.data._M_elems[0x10] = 0;
      y.m_backend.data._M_elems[0x11] = 0;
      y.m_backend.data._M_elems[0x12] = 0;
      y.m_backend.data._M_elems[0x13] = 0;
      y.m_backend.data._M_elems[0x14] = 0;
      y.m_backend.data._M_elems[0x15] = 0;
      y.m_backend.data._M_elems[0x16] = 0;
      y.m_backend.data._M_elems[0x17] = 0;
      y.m_backend.data._M_elems[0x18] = 0;
      y.m_backend.data._M_elems[0x19] = 0;
      y.m_backend.data._M_elems._104_5_ = 0;
      y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      y.m_backend.exp = 0;
      y.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&y.m_backend,&result_1.m_backend,&local_138);
      pcVar13 = &y.m_backend;
      pnVar12 = val;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      (val->m_backend).exp = y.m_backend.exp;
      (val->m_backend).neg = y.m_backend.neg;
      (val->m_backend).fpclass = y.m_backend.fpclass;
      (val->m_backend).prec_elem = y.m_backend.prec_elem;
      return local_2f4;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)val,0.0);
  return local_2f4;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}